

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined1 (*pauVar1) [32];
  ImVec4 *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImVec2 IVar8;
  ImVec4 *pIVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  undefined8 *puVar14;
  ImVec2 *pIVar15;
  ImDrawVert *pIVar16;
  int iVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ImDrawIdx IVar20;
  undefined7 in_register_00000081;
  ImDrawIdx *pIVar21;
  short sVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ImDrawIdx IVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar46;
  undefined8 uVar39;
  undefined1 auVar40 [16];
  float fVar47;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  float fVar60;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  ulong local_68;
  ulong local_60;
  ulong local_58;
  int local_50;
  undefined4 local_4c;
  int local_48;
  uint local_44;
  undefined1 (*local_40) [32];
  float local_38;
  byte local_31;
  
  auVar32._4_60_ = in_register_00001204;
  auVar32._0_4_ = thickness;
  if (1 < points_count) {
    IVar8 = this->_Data->TexUvWhitePixel;
    local_68 = (ulong)(points_count - 1U);
    local_60 = (ulong)(points_count - 1U);
    if (closed) {
      local_60 = (ulong)(uint)points_count;
    }
    local_40 = (undefined1 (*) [32])CONCAT44(local_40._4_4_,thickness);
    iVar23 = (int)local_60;
    if ((this->Flags & 1U) == 0) {
      uStack_80 = 0x185835;
      PrimReserve(this,iVar23 * 6,iVar23 * 4);
      pIVar16 = this->_VtxWritePtr;
      uVar24 = 1;
      do {
        uVar12 = uVar24 & 0xffffffff;
        if ((uint)points_count == uVar24) {
          uVar12 = 0;
        }
        fVar54 = points[uVar24 - 1].y;
        fVar46 = points[uVar12].x - points[uVar24 - 1].x;
        fVar53 = points[uVar12].y - fVar54;
        fVar38 = fVar46 * fVar46 + fVar53 * fVar53;
        auVar30 = ZEXT416((uint)fVar38);
        auVar33 = vsqrtss_avx(auVar30,auVar30);
        fVar60 = 1.0 / auVar33._0_4_;
        if (0.0 < fVar38) {
          fVar46 = fVar60 * fVar46;
        }
        auVar33 = vcmpss_avx(ZEXT816(0) << 0x40,auVar30,1);
        auVar33 = vblendvps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)(fVar60 * fVar53)),auVar33);
        fVar46 = local_40._0_4_ * 0.5 * fVar46;
        fVar38 = local_40._0_4_ * 0.5 * auVar33._0_4_;
        (pIVar16->pos).x = points[uVar24 - 1].x + fVar38;
        (pIVar16->pos).y = fVar54 - fVar46;
        pIVar16->uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16->col = col;
        pIVar16[1].pos.x = fVar38 + points[uVar12].x;
        pIVar16[1].pos.y = points[uVar12].y - fVar46;
        pIVar16[1].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[1].col = col;
        pIVar16[2].pos.x = points[uVar12].x - fVar38;
        pIVar16[2].pos.y = fVar46 + points[uVar12].y;
        pIVar16[2].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[2].col = col;
        pIVar16[3].pos.x = points[uVar24 - 1].x - fVar38;
        pIVar16[3].pos.y = fVar46 + points[uVar24 - 1].y;
        pIVar16[3].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[3].col = col;
        pIVar16 = pIVar16 + 4;
        this->_VtxWritePtr = pIVar16;
        uVar25 = this->_VtxCurrentIdx;
        pIVar21 = this->_IdxWritePtr;
        IVar20 = (ImDrawIdx)uVar25;
        *pIVar21 = IVar20;
        pIVar21[1] = IVar20 + 1;
        pIVar21[2] = IVar20 + 2;
        pIVar21[3] = IVar20;
        pIVar21[4] = IVar20 + 2;
        pIVar21[5] = IVar20 + 3;
        this->_IdxWritePtr = pIVar21 + 6;
        this->_VtxCurrentIdx = uVar25 + 4;
        bVar29 = uVar24 != (local_60 & 0xffffffff);
        uVar24 = uVar24 + 1;
      } while (bVar29);
    }
    else {
      auVar33 = vmaxss_avx(auVar32._0_16_,SUB6416(ZEXT464(0x3f800000),0));
      local_38 = auVar33._0_4_;
      local_48 = (int)local_38;
      fVar54 = this->_FringeScale;
      local_31 = fVar54 == 1.0 & local_48 < 0x3f & (byte)this->Flags >> 1 &
                 local_38 - (float)local_48 <= 1e-05;
      iVar13 = 0x12;
      if (thickness <= fVar54) {
        iVar13 = 0xc;
      }
      iVar17 = 6;
      if (local_31 == 0) {
        iVar17 = iVar13;
      }
      local_78 = ZEXT416((uint)fVar54);
      local_4c = (undefined4)CONCAT71(in_register_00000081,closed);
      if (local_31 == 1) {
        local_50 = points_count * 2;
        local_58 = 3;
      }
      else {
        local_50 = points_count * 3;
        if (fVar54 < thickness) {
          local_50 = points_count * 4;
        }
        local_58 = (ulong)((uint)(fVar54 < thickness) * 2 + 3);
      }
      local_44 = col & 0xffffff;
      uStack_80 = 0x185a8a;
      PrimReserve(this,iVar17 * iVar23,local_50);
      bVar11 = local_31;
      auVar33 = _DAT_001f17a0;
      lVar10 = -((ulong)(uint)((int)local_58 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      puVar14 = (undefined8 *)(local_78 + lVar10);
      uVar12 = (ulong)(uint)points_count;
      pauVar1 = (undefined1 (*) [32])(puVar14 + uVar12);
      uVar28 = local_60 & 0xffffffff;
      uVar24 = 1;
      do {
        uVar18 = uVar24 & 0xffffffff;
        if (uVar12 == uVar24) {
          uVar18 = 0;
        }
        fVar38 = points[uVar18].x - points[uVar24 - 1].x;
        fVar46 = points[uVar18].y - points[uVar24 - 1].y;
        fVar54 = fVar38 * fVar38 + fVar46 * fVar46;
        auVar34 = ZEXT416((uint)fVar54);
        auVar30 = vsqrtss_avx(auVar34,auVar34);
        fVar53 = 1.0 / auVar30._0_4_;
        if (0.0 < fVar54) {
          fVar38 = fVar38 * fVar53;
        }
        auVar30 = vcmpss_avx(ZEXT816(0) << 0x40,auVar34,1);
        auVar30 = vblendvps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)(fVar46 * fVar53)),auVar30);
        *(int *)(local_78 + uVar24 * 8 + lVar10 + -8) = auVar30._0_4_;
        *(float *)(local_78 + uVar24 * 8 + lVar10 + -4) = -fVar38;
        bVar29 = uVar24 != uVar28;
        uVar24 = uVar24 + 1;
      } while (bVar29);
      fVar54 = (float)local_78._0_4_;
      if ((char)local_4c == '\0') {
        uVar24 = local_68 & 0xffffffff;
        puVar14[uVar24] = *(undefined8 *)((long)pauVar1[-1] + 0x10);
        IVar5 = points[uVar24];
        auVar30._8_8_ = 0;
        auVar30._0_4_ = IVar5.x;
        auVar30._4_4_ = IVar5.y;
        fVar38 = IVar5.x;
        fVar46 = IVar5.y;
        if (local_40._0_4_ <= (float)local_78._0_4_ || bVar11 != 0) {
          if (bVar11 != 0) {
            fVar54 = local_38 * 0.5 + 1.0;
          }
          auVar33._0_4_ = fVar54 * (float)*puVar14;
          auVar33._4_4_ = fVar54 * (float)((ulong)*puVar14 >> 0x20);
          auVar33._8_4_ = fVar54 * 0.0;
          auVar33._12_4_ = fVar54 * 0.0;
          IVar5 = *points;
          auVar40._8_8_ = 0;
          auVar40._0_4_ = IVar5.x;
          auVar40._4_4_ = IVar5.y;
          auVar48._0_4_ = auVar33._0_4_ + IVar5.x;
          auVar48._4_4_ = auVar33._4_4_ + IVar5.y;
          auVar48._8_4_ = auVar33._8_4_ + 0.0;
          auVar48._12_4_ = auVar33._12_4_ + 0.0;
          auVar33 = vsubps_avx(auVar40,auVar33);
          auVar33 = vmovlhps_avx(auVar48,auVar33);
          *(undefined1 (*) [16])*pauVar1 = auVar33;
          auVar34._0_4_ = fVar54 * (float)puVar14[uVar24] + fVar38;
          auVar34._4_4_ = fVar54 * (float)((ulong)puVar14[uVar24] >> 0x20) + fVar46;
          auVar34._8_4_ = fVar54 * 0.0 + 0.0;
          auVar34._12_4_ = fVar54 * 0.0 + 0.0;
          uVar18 = (ulong)(uint)((int)local_68 * 2);
          uVar39 = vmovlps_avx(auVar34);
          *(undefined8 *)((long)*pauVar1 + uVar18 * 8) = uVar39;
          auVar35._0_4_ = fVar54 * (float)puVar14[uVar24];
          auVar35._4_4_ = fVar54 * (float)((ulong)puVar14[uVar24] >> 0x20);
          auVar35._8_4_ = fVar54 * 0.0;
          auVar35._12_4_ = fVar54 * 0.0;
          auVar33 = vsubps_avx(auVar30,auVar35);
          local_40 = pauVar1;
          uVar39 = vmovlps_avx(auVar33);
          *(undefined8 *)((long)*pauVar1 + (uVar18 + 1) * 8) = uVar39;
          goto LAB_00185c24;
        }
        fVar53 = (local_38 - (float)local_78._0_4_) * 0.5;
        fVar54 = (float)local_78._0_4_ + fVar53;
        fVar60 = (float)*puVar14;
        auVar51._0_4_ = fVar60 * fVar54;
        fVar47 = (float)((ulong)*puVar14 >> 0x20);
        auVar51._4_4_ = fVar47 * fVar54;
        auVar51._8_4_ = fVar54 * 0.0;
        auVar51._12_4_ = fVar54 * 0.0;
        IVar5 = *points;
        auVar56._8_8_ = 0;
        auVar56._0_4_ = IVar5.x;
        auVar56._4_4_ = IVar5.y;
        auVar45._4_4_ = auVar51._4_4_ + IVar5.y;
        auVar45._0_4_ = auVar51._0_4_ + IVar5.x;
        auVar45._8_4_ = auVar51._8_4_ + 0.0;
        auVar45._12_4_ = auVar51._12_4_ + 0.0;
        auVar41._0_4_ = fVar53 * fVar60;
        auVar41._4_4_ = fVar53 * fVar47;
        auVar41._8_4_ = fVar53 * 0.0;
        auVar41._12_4_ = fVar53 * 0.0;
        auVar52._4_4_ = auVar41._4_4_ + IVar5.y;
        auVar52._0_4_ = auVar41._0_4_ + IVar5.x;
        auVar52._8_4_ = auVar41._8_4_ + 0.0;
        auVar52._12_4_ = auVar41._12_4_ + 0.0;
        auVar34 = vsubps_avx(auVar56,auVar51);
        auVar52._16_16_ = auVar34;
        auVar34 = vsubps_avx(auVar56,auVar41);
        auVar45._16_16_ = auVar34;
        auVar45 = vunpcklpd_avx(auVar45,auVar52);
        *pauVar1 = auVar45;
        auVar42._0_4_ = fVar54 * (float)puVar14[uVar24] + fVar38;
        auVar42._4_4_ = fVar54 * (float)((ulong)puVar14[uVar24] >> 0x20) + fVar46;
        auVar42._8_4_ = fVar54 * 0.0 + 0.0;
        auVar42._12_4_ = fVar54 * 0.0 + 0.0;
        uVar18 = (ulong)(uint)((int)local_68 << 2);
        uVar39 = vmovlps_avx(auVar42);
        *(undefined8 *)((long)*pauVar1 + uVar18 * 8) = uVar39;
        auVar43._0_4_ = fVar38 + fVar53 * (float)puVar14[uVar24];
        auVar43._4_4_ = fVar46 + fVar53 * (float)((ulong)puVar14[uVar24] >> 0x20);
        auVar43._8_4_ = fVar53 * 0.0 + 0.0;
        auVar43._12_4_ = fVar53 * 0.0 + 0.0;
        uVar39 = vmovlps_avx(auVar43);
        *(undefined8 *)((long)*pauVar1 + (uVar18 + 1) * 8) = uVar39;
        auVar44._0_4_ = fVar53 * (float)puVar14[uVar24];
        auVar44._4_4_ = fVar53 * (float)((ulong)puVar14[uVar24] >> 0x20);
        auVar44._8_4_ = fVar53 * 0.0;
        auVar44._12_4_ = fVar53 * 0.0;
        auVar34 = vsubps_avx(auVar30,auVar44);
        uVar39 = vmovlps_avx(auVar34);
        *(undefined8 *)((long)*pauVar1 + (uVar18 + 2) * 8) = uVar39;
        auVar37._0_4_ = fVar54 * (float)puVar14[uVar24];
        auVar37._4_4_ = fVar54 * (float)((ulong)puVar14[uVar24] >> 0x20);
        auVar37._8_4_ = fVar54 * 0.0;
        auVar37._12_4_ = fVar54 * 0.0;
        auVar30 = vsubps_avx(auVar30,auVar37);
        uVar39 = vmovlps_avx(auVar30);
        *(undefined8 *)((long)*pauVar1 + (uVar18 + 3) * 8) = uVar39;
      }
      else {
        if (local_40._0_4_ <= (float)local_78._0_4_ || bVar11 != 0) {
          if (bVar11 != 0) {
            fVar54 = local_38 * 0.5 + 1.0;
          }
          local_40 = pauVar1;
LAB_00185c24:
          pIVar21 = this->_IdxWritePtr;
          uVar24 = 1;
          uVar25 = this->_VtxCurrentIdx;
LAB_00185c52:
          uVar18 = uVar24 & 0xffffffff;
          if (uVar12 == uVar24) {
            uVar18 = 0;
          }
          uVar26 = uVar25 + (bVar11 ^ 3);
          if (uVar12 == uVar24) {
            uVar26 = this->_VtxCurrentIdx;
          }
          fVar38 = ((float)*(undefined8 *)(local_78 + uVar24 * 8 + lVar10 + -8) +
                   (float)puVar14[uVar18]) * 0.5;
          fVar46 = ((float)((ulong)*(undefined8 *)(local_78 + uVar24 * 8 + lVar10 + -8) >> 0x20) +
                   (float)((ulong)puVar14[uVar18] >> 0x20)) * 0.5;
          auVar49._0_4_ = fVar38 * fVar38;
          auVar49._4_4_ = fVar46 * fVar46;
          auVar49._8_8_ = 0;
          auVar33 = vmovshdup_avx(auVar49);
          IVar5 = points[uVar18];
          auVar55._8_4_ = IVar5.x;
          auVar55._12_4_ = IVar5.y;
          auVar55._0_4_ = IVar5.x;
          auVar55._4_4_ = IVar5.y;
          auVar33 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                               ZEXT416((uint)(fVar38 * fVar38 + auVar33._0_4_)));
          fVar53 = 1.0 / auVar33._0_4_;
          fVar38 = fVar54 * fVar38 * fVar53;
          fVar46 = fVar54 * fVar46 * fVar53;
          uVar39 = CONCAT44(fVar46,fVar38);
          auVar50._8_8_ = uVar39;
          auVar50._0_8_ = uVar39;
          auVar33 = vsubps_avx(auVar55,auVar50);
          *(undefined8 *)((long)*local_40 + (ulong)(uint)((int)uVar18 * 2) * 8) =
               CONCAT44(IVar5.y + fVar46,IVar5.x + fVar38);
          ((undefined8 *)((long)*local_40 + (ulong)(uint)((int)uVar18 * 2) * 8))[1] = auVar33._8_8_;
          IVar20 = (ImDrawIdx)uVar26;
          *pIVar21 = IVar20;
          IVar27 = (ImDrawIdx)uVar25;
          pIVar21[1] = IVar27;
          if (local_31 == 0) {
            pIVar21[2] = IVar27 + 2;
            pIVar21[3] = IVar27 + 2;
            pIVar21[4] = IVar20 + 2;
            pIVar21[5] = IVar20;
            pIVar21[6] = IVar20 + 1;
            pIVar21[7] = IVar27 + 1;
            pIVar21[8] = IVar27;
            pIVar21[9] = IVar27;
            pIVar21[10] = IVar20;
            pIVar21[0xb] = IVar20 + 1;
            pIVar21 = pIVar21 + 0xc;
            this->_IdxWritePtr = pIVar21;
            if (uVar28 != uVar24) goto LAB_00185d5b;
            pIVar16 = this->_VtxWritePtr;
            pIVar15 = (ImVec2 *)(puVar14 + uVar12 + 1);
            uVar24 = 0;
            do {
              pIVar16->pos = points[uVar24];
              this->_VtxWritePtr->uv = IVar8;
              pIVar16 = this->_VtxWritePtr;
              pIVar16->col = col;
              pIVar16[1].pos = pIVar15[-1];
              this->_VtxWritePtr[1].uv = IVar8;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[1].col = local_44;
              pIVar16[2].pos = *pIVar15;
              this->_VtxWritePtr[2].uv = IVar8;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[2].col = local_44;
              pIVar16 = pIVar16 + 3;
              this->_VtxWritePtr = pIVar16;
              uVar24 = uVar24 + 1;
              pIVar15 = pIVar15 + 2;
            } while (uVar12 != uVar24);
          }
          else {
            pIVar21[2] = IVar27 + 1;
            pIVar21[3] = IVar20 + 1;
            pIVar21[4] = IVar27 + 1;
            pIVar21[5] = IVar20;
            pIVar21 = pIVar21 + 6;
            this->_IdxWritePtr = pIVar21;
            if (uVar28 != uVar24) goto LAB_00185d5b;
            pIVar16 = this->_VtxWritePtr;
            pIVar9 = this->_Data->TexUvLines;
            pIVar2 = pIVar9 + local_48;
            uVar3 = pIVar2->x;
            uVar6 = pIVar2->y;
            auVar31._4_4_ = uVar6;
            auVar31._0_4_ = uVar3;
            auVar31._8_8_ = 0;
            pIVar9 = pIVar9 + local_48;
            uVar4 = pIVar9->z;
            uVar7 = pIVar9->w;
            auVar36._4_4_ = uVar7;
            auVar36._0_4_ = uVar4;
            auVar36._8_8_ = 0;
            pIVar15 = (ImVec2 *)(puVar14 + uVar12 + 1);
            do {
              pIVar16->pos = pIVar15[-1];
              IVar8 = (ImVec2)vmovlps_avx(auVar31);
              this->_VtxWritePtr->uv = IVar8;
              pIVar16 = this->_VtxWritePtr;
              pIVar16->col = col;
              pIVar16[1].pos = *pIVar15;
              IVar8 = (ImVec2)vmovlps_avx(auVar36);
              this->_VtxWritePtr[1].uv = IVar8;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[1].col = col;
              pIVar16 = pIVar16 + 2;
              this->_VtxWritePtr = pIVar16;
              pIVar15 = pIVar15 + 2;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          goto LAB_001860a5;
        }
        fVar53 = (local_38 - (float)local_78._0_4_) * 0.5;
      }
      pauVar19 = (undefined1 (*) [16])this->_IdxWritePtr;
      auVar30 = vshufps_avx(ZEXT416((uint)((float)local_78._0_4_ + fVar53)),ZEXT416((uint)fVar53),0)
      ;
      uVar24 = 1;
      uVar25 = this->_VtxCurrentIdx;
      do {
        uVar18 = uVar24 & 0xffffffff;
        if (uVar12 == uVar24) {
          uVar18 = 0;
        }
        fVar54 = ((float)*(undefined8 *)(local_78 + uVar24 * 8 + lVar10 + -8) +
                 (float)puVar14[uVar18]) * 0.5;
        fVar38 = ((float)((ulong)*(undefined8 *)(local_78 + uVar24 * 8 + lVar10 + -8) >> 0x20) +
                 (float)((ulong)puVar14[uVar18] >> 0x20)) * 0.5;
        auVar58._0_4_ = fVar54 * fVar54;
        auVar58._4_4_ = fVar38 * fVar38;
        auVar58._8_8_ = 0;
        auVar34 = vmovshdup_avx(auVar58);
        uVar26 = uVar25 + 4;
        if (uVar12 == uVar24) {
          uVar26 = this->_VtxCurrentIdx;
        }
        IVar5 = points[uVar18];
        auVar59._8_4_ = IVar5.x;
        auVar59._12_4_ = IVar5.y;
        auVar59._0_4_ = IVar5.x;
        auVar59._4_4_ = IVar5.y;
        auVar59._16_4_ = IVar5.x;
        auVar59._20_4_ = IVar5.y;
        auVar59._24_4_ = IVar5.x;
        auVar59._28_4_ = IVar5.y;
        auVar34 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                             ZEXT416((uint)(fVar54 * fVar54 + auVar34._0_4_)));
        fVar60 = 1.0 / auVar34._0_4_;
        fVar46 = auVar30._0_4_ * fVar54 * fVar60;
        fVar53 = auVar30._4_4_ * fVar38 * fVar60;
        fVar54 = auVar30._8_4_ * fVar54 * fVar60;
        fVar38 = auVar30._12_4_ * fVar38 * fVar60;
        auVar45 = vpermpd_avx2(ZEXT1632(CONCAT412(fVar38,CONCAT48(fVar54,CONCAT44(fVar53,fVar46)))),
                               0x14);
        fVar60 = IVar5.x;
        auVar57._0_4_ = fVar60 + fVar46;
        fVar46 = IVar5.y;
        auVar57._4_4_ = fVar46 + fVar53;
        auVar57._8_4_ = fVar60 + fVar54;
        auVar57._12_4_ = fVar46 + fVar38;
        auVar57._16_4_ = fVar60 + 0.0;
        auVar57._20_4_ = fVar46 + 0.0;
        auVar57._24_4_ = fVar60 + 0.0;
        auVar57._28_4_ = fVar46 + 0.0;
        auVar45 = vsubps_avx(auVar59,auVar45);
        auVar45 = vblendps_avx(auVar57,auVar45,0xf0);
        auVar34 = vpinsrw_avx(ZEXT416(uVar26),uVar25,1);
        auVar34 = vpshuflw_avx(auVar34,0x14);
        *(undefined1 (*) [32])((long)*pauVar1 + (ulong)(uint)((int)uVar18 << 2) * 8) = auVar45;
        auVar34 = vpaddw_avx(auVar34,ZEXT816(0x2000200010001));
        auVar35 = vpshufb_avx(auVar34,auVar33);
        *pauVar19 = auVar35;
        sVar22 = (short)uVar25;
        *(short *)pauVar19[1] = sVar22;
        *(short *)(pauVar19[1] + 2) = sVar22;
        *(short *)(pauVar19[1] + 4) = (short)uVar26;
        auVar35 = vpshuflw_avx(auVar34,0xec);
        *(int *)(pauVar19[1] + 6) = auVar35._0_4_;
        vpextrw_avx(auVar34,2);
        *(short *)(pauVar19[1] + 0xc) = sVar22 + 3;
        *(short *)(pauVar19[1] + 0xe) = sVar22 + 3;
        *(short *)pauVar19[2] = (short)uVar26 + 3;
        vpextrw_avx(auVar34,3);
        pauVar19 = (undefined1 (*) [16])(pauVar19[2] + 4);
        bVar29 = uVar24 != uVar28;
        uVar24 = uVar24 + 1;
        uVar25 = uVar26;
      } while (bVar29);
      this->_IdxWritePtr = (ImDrawIdx *)pauVar19;
      pIVar16 = this->_VtxWritePtr;
      pIVar15 = (ImVec2 *)(puVar14 + uVar12 + 3);
      do {
        pIVar16->pos = pIVar15[-3];
        this->_VtxWritePtr->uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16->col = local_44;
        pIVar16[1].pos = pIVar15[-2];
        this->_VtxWritePtr[1].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[1].col = col;
        pIVar16[2].pos = pIVar15[-1];
        this->_VtxWritePtr[2].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[2].col = col;
        pIVar16[3].pos = *pIVar15;
        this->_VtxWritePtr[3].uv = IVar8;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[3].col = local_44;
        pIVar16 = pIVar16 + 4;
        this->_VtxWritePtr = pIVar16;
        pIVar15 = pIVar15 + 4;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
LAB_001860a5:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_50;
    }
  }
  return;
LAB_00185d5b:
  uVar24 = uVar24 + 1;
  uVar25 = uVar26;
  goto LAB_00185c52;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}